

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O3

void uset_setSerializedToOne_63(USerializedSet *fillSet,UChar32 c)

{
  uint16_t uVar1;
  
  if (0x10ffff < (uint)c || fillSet == (USerializedSet *)0x0) {
    return;
  }
  fillSet->array = fillSet->staticArray;
  uVar1 = (uint16_t)c;
  if ((uint)c < 0xffff) {
    fillSet->bmpLength = 2;
    fillSet->length = 2;
    fillSet->staticArray[0] = uVar1;
    fillSet->staticArray[1] = uVar1 + 1;
    return;
  }
  if (c == 0xffff) {
    fillSet->bmpLength = 1;
    fillSet->length = 3;
    fillSet->staticArray[0] = 0xffff;
    fillSet->staticArray[1] = 1;
    fillSet->staticArray[2] = 0;
    return;
  }
  fillSet->bmpLength = 0;
  if ((uint)c < 0x10ffff) {
    fillSet->length = 4;
    fillSet->staticArray[0] = (uint16_t)((uint)c >> 0x10);
    fillSet->staticArray[1] = uVar1;
    fillSet->staticArray[2] = (uint16_t)((uint)(c + 1) >> 0x10);
    fillSet->staticArray[3] = (uint16_t)(c + 1);
    return;
  }
  fillSet->length = 2;
  fillSet->staticArray[0] = 0x10;
  fillSet->staticArray[1] = 0xffff;
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uset_setSerializedToOne(USerializedSet* fillSet, UChar32 c) {
    if(fillSet==NULL || (uint32_t)c>0x10ffff) {
        return;
    }

    fillSet->array=fillSet->staticArray;
    if(c<0xffff) {
        fillSet->bmpLength=fillSet->length=2;
        fillSet->staticArray[0]=(uint16_t)c;
        fillSet->staticArray[1]=(uint16_t)c+1;
    } else if(c==0xffff) {
        fillSet->bmpLength=1;
        fillSet->length=3;
        fillSet->staticArray[0]=0xffff;
        fillSet->staticArray[1]=1;
        fillSet->staticArray[2]=0;
    } else if(c<0x10ffff) {
        fillSet->bmpLength=0;
        fillSet->length=4;
        fillSet->staticArray[0]=(uint16_t)(c>>16);
        fillSet->staticArray[1]=(uint16_t)c;
        ++c;
        fillSet->staticArray[2]=(uint16_t)(c>>16);
        fillSet->staticArray[3]=(uint16_t)c;
    } else /* c==0x10ffff */ {
        fillSet->bmpLength=0;
        fillSet->length=2;
        fillSet->staticArray[0]=0x10;
        fillSet->staticArray[1]=0xffff;
    }
}